

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void jinit_1pass_quantizer(j_decompress_ptr cinfo)

{
  jpeg_color_quantizer *pjVar1;
  my_cquantize_ptr cquantize;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = (jpeg_color_quantizer *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x98);
  cinfo->cquantize = pjVar1;
  pjVar1->start_pass = start_pass_1_quant;
  pjVar1->finish_pass = finish_pass_1_quant;
  pjVar1->new_color_map = new_color_map_1_quant;
  pjVar1[3].finish_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar1[2].finish_pass = (_func_void_j_decompress_ptr *)0x0;
  if (4 < cinfo->out_color_components) {
    cinfo->err->msg_code = 0x39;
    (cinfo->err->msg_parm).i[0] = 4;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (0x100 < cinfo->desired_number_of_colors) {
    cinfo->err->msg_code = 0x3b;
    (cinfo->err->msg_parm).i[0] = 0x100;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  create_colormap(cinfo);
  create_colorindex(cinfo);
  if (cinfo->dither_mode == JDITHER_FS) {
    alloc_fs_workspace(cinfo);
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_1pass_quantizer (j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize;

  cquantize = (my_cquantize_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_cquantizer));
  cinfo->cquantize = (struct jpeg_color_quantizer *) cquantize;
  cquantize->pub.start_pass = start_pass_1_quant;
  cquantize->pub.finish_pass = finish_pass_1_quant;
  cquantize->pub.new_color_map = new_color_map_1_quant;
  cquantize->fserrors[0] = NULL; /* Flag FS workspace not allocated */
  cquantize->odither[0] = NULL;	/* Also flag odither arrays not allocated */

  /* Make sure my internal arrays won't overflow */
  if (cinfo->out_color_components > MAX_Q_COMPS)
    ERREXIT1(cinfo, JERR_QUANT_COMPONENTS, MAX_Q_COMPS);
  /* Make sure colormap indexes can be represented by JSAMPLEs */
  if (cinfo->desired_number_of_colors > (MAXJSAMPLE+1))
    ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, MAXJSAMPLE+1);

  /* Create the colormap and color index table. */
  create_colormap(cinfo);
  create_colorindex(cinfo);

  /* Allocate Floyd-Steinberg workspace now if requested.
   * We do this now since it is FAR storage and may affect the memory
   * manager's space calculations.  If the user changes to FS dither
   * mode in a later pass, we will allocate the space then, and will
   * possibly overrun the max_memory_to_use setting.
   */
  if (cinfo->dither_mode == JDITHER_FS)
    alloc_fs_workspace(cinfo);
}